

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxId enterId,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterTest,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterUB,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *enterLB,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterVal,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterMax,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterPric,Status *enterStat,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *enterRO,StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *objChange)

{
  uint *puVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  undefined4 uVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  Real RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  Status SVar16;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  Status *pSVar19;
  undefined8 *puVar20;
  cpp_dec_float<50u,int,void> *pcVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  long lVar25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  long in_FS_OFFSET;
  undefined4 uVar27;
  undefined4 uVar28;
  uint uVar29;
  cpp_dec_float<50U,_int,_void> local_3e8;
  long local_3b0;
  cpp_dec_float<50U,_int,_void> *local_3a8;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  undefined8 local_398;
  undefined4 uStack_390;
  uint uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  DataKey local_370;
  cpp_dec_float<50U,_int,_void> local_368;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined5 uStack_310;
  undefined3 uStack_30b;
  undefined5 uStack_308;
  undefined8 uStack_303;
  undefined8 local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined5 uStack_250;
  undefined3 uStack_24b;
  undefined5 uStack_248;
  undefined8 uStack_243;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 uStack_188;
  undefined8 uStack_183;
  undefined8 local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 uStack_c8;
  undefined8 uStack_c3;
  undefined8 local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_3a8 = &enterVal->m_backend;
  local_398 = &enterUB->m_backend;
  local_370 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_3e8,(SPxId *)&local_370);
    iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_3e8);
    lVar25 = (long)iVar15;
    *enterStat = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat.data[lVar25];
    if (this->theRep == ROW) {
      computePvec((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar15);
      computeTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_3e8,this,iVar15);
      *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterTest->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterTest->m_backend).exp = local_3e8.exp;
      (enterTest->m_backend).neg = local_3e8.neg;
      (enterTest->m_backend).fpclass = local_3e8.fpclass;
      (enterTest->m_backend).prec_elem = local_3e8.prec_elem;
      pVVar17 = &this->theTest;
    }
    else {
      pVVar17 = &this->theCoTest;
      pnVar5 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar9;
      (enterTest->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterTest->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterTest->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterTest->m_backend).prec_elem = iVar3;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(pVVar17->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend,0);
    local_3b0 = lVar25;
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      local_388 = *(double *)(in_FS_OFFSET + -8);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      uStack_380 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      uStack_38c = uStack_380._4_4_ ^ 0x80000000;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_398 = (cpp_dec_float<50U,_int,_void> *)-local_388;
      uStack_390 = (undefined4)uStack_380;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-local_388);
      *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterLB->m_backend).exp = local_3e8.exp;
      (enterLB->m_backend).neg = local_3e8.neg;
      (enterLB->m_backend).fpclass = local_3e8.fpclass;
      (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a8,0);
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(enterRO->m_backend).data._M_elems =
           *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      uVar4 = pnVar5[lVar25].m_backend.fpclass;
      uVar7 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = uVar4;
      (enterRO->m_backend).prec_elem = uVar7;
      if ((((enterPric->m_backend).fpclass == cpp_dec_float_NaN) || (uVar4 == 2)) ||
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&enterRO->m_backend), iVar15 < 1)) {
        uStack_380 = CONCAT44(uStack_38c,uStack_390);
        local_388 = (double)local_398;
      }
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pSVar19 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00243643;
    case D_ON_UPPER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
      local_398->exp = pnVar5[lVar25].m_backend.exp;
      local_398->neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_388 = -*(double *)(in_FS_OFFSET + -8);
      uStack_380 = 0x8000000000000000;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterLB->m_backend).exp = local_3e8.exp;
      (enterLB->m_backend).neg = local_3e8.neg;
      (enterLB->m_backend).fpclass = local_3e8.fpclass;
      (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar9 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a8->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
      local_3a8->exp = local_398->exp;
      local_3a8->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a8->fpclass = local_398->fpclass;
      local_3a8->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      lVar13 = local_3b0;
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar15 = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).exp = iVar15;
      bVar14 = pnVar5[lVar25].m_backend.neg;
      (enterRO->m_backend).neg = bVar14;
      fVar2 = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar15;
        local_3e8.neg = bVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar13] = P_ON_LOWER;
      return;
    case D_ON_LOWER:
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
      (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterLB->m_backend).prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_388 = *(double *)(in_FS_OFFSET + -8);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      uVar6 = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      uVar9 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      uVar10 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      *(undefined8 *)((local_3a8->data)._M_elems + 4) =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
      local_3a8->exp = (enterLB->m_backend).exp;
      local_3a8->neg = (enterLB->m_backend).neg;
      iVar3 = (enterLB->m_backend).prec_elem;
      local_3a8->fpclass = (enterLB->m_backend).fpclass;
      local_3a8->prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      lVar13 = local_3b0;
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar15 = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).exp = iVar15;
      bVar14 = pnVar5[lVar25].m_backend.neg;
      (enterRO->m_backend).neg = bVar14;
      fVar2 = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar15;
        local_3e8.neg = bVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar13] = P_ON_UPPER;
      return;
    case D_ON_BOTH:
      pnVar5 = (this->thePvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      if ((((int)uVar6 == 2) ||
          (pnVar5 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar5[lVar25].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&enterPric->m_backend,&pnVar5[lVar25].m_backend), iVar15 < 1)) {
        pnVar5 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
        *(undefined8 *)((local_398->data)._M_elems + 8) = uVar6;
        uVar9 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
        uVar10 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((local_398->data)._M_elems + 4) = uVar11;
        *(undefined8 *)((local_398->data)._M_elems + 6) = uVar12;
        *(undefined8 *)(local_398->data)._M_elems = uVar9;
        *(undefined8 *)((local_398->data)._M_elems + 2) = uVar10;
        local_398->exp = pnVar5[lVar25].m_backend.exp;
        local_398->neg = pnVar5[lVar25].m_backend.neg;
        iVar3 = pnVar5[lVar25].m_backend.prec_elem;
        local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
        local_398->prec_elem = iVar3;
        *(undefined8 *)((local_3a8->data)._M_elems + 8) = uVar6;
        *(undefined8 *)((local_3a8->data)._M_elems + 4) = uVar11;
        *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar12;
        *(undefined8 *)(local_3a8->data)._M_elems = uVar9;
        *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar10;
        local_3a8->exp = local_398->exp;
        local_3a8->neg = local_398->neg;
        iVar3 = local_398->prec_elem;
        local_3a8->fpclass = local_398->fpclass;
        local_3a8->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        local_3a8 = (cpp_dec_float<50U,_int,_void> *)
                    ((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
        uStack_3a0 = 0;
        uStack_39c = 0x80000000;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
        *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterLB->m_backend).exp = local_3e8.exp;
        (enterLB->m_backend).neg = local_3e8.neg;
        (enterLB->m_backend).fpclass = local_3e8.fpclass;
        (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3a8);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        pVVar17 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left;
        SVar16 = P_ON_LOWER;
      }
      else {
        pnVar5 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) = uVar6;
        uVar9 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
        uVar10 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = uVar11;
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar12;
        *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar9;
        *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar10;
        (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
        (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
        iVar3 = pnVar5[lVar25].m_backend.prec_elem;
        (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
        (enterLB->m_backend).prec_elem = iVar3;
        *(undefined8 *)((local_3a8->data)._M_elems + 8) = uVar6;
        *(undefined8 *)((local_3a8->data)._M_elems + 4) = uVar11;
        *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar12;
        *(undefined8 *)(local_3a8->data)._M_elems = uVar9;
        *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar10;
        local_3a8->exp = (enterLB->m_backend).exp;
        local_3a8->neg = (enterLB->m_backend).neg;
        iVar3 = (enterLB->m_backend).prec_elem;
        local_3a8->fpclass = (enterLB->m_backend).fpclass;
        local_3a8->prec_elem = iVar3;
        ::soplex::infinity::__tls_init();
        local_3a8 = *(cpp_dec_float<50U,_int,_void> **)(in_FS_OFFSET + -8);
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3a8);
        *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((local_398->data)._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((local_398->data)._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        local_398->exp = local_3e8.exp;
        local_398->neg = local_3e8.neg;
        local_398->fpclass = local_3e8.fpclass;
        local_398->prec_elem = local_3e8.prec_elem;
        ::soplex::infinity::__tls_init();
        pVVar17 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right;
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 10;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems._24_5_ = 0;
        local_3e8.data._M_elems[7]._1_3_ = 0;
        local_3e8.data._M_elems._32_5_ = 0;
        local_3e8.data._M_elems[9]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3a8);
        *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
        *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
        *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
             CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
        *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
             CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
        (enterMax->m_backend).exp = local_3e8.exp;
        (enterMax->m_backend).neg = local_3e8.neg;
        (enterMax->m_backend).fpclass = local_3e8.fpclass;
        (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
        SVar16 = P_ON_UPPER;
      }
      pnVar5 = (pVVar17->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[local_3b0] = SVar16;
      pcVar18 = &(this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      pcVar22 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = pcVar18;
      if ((&local_3e8 != pcVar22) && (pcVar23 = pcVar22, &local_3e8 != pcVar18)) {
        uVar6 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = pcVar18->exp;
        local_3e8.neg = pcVar18->neg;
        local_3e8.fpclass = pcVar18->fpclass;
        local_3e8.prec_elem = pcVar18->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      pcVar18 = &(this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      pcVar22 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = pcVar18;
      if ((&local_3e8 != pcVar22) && (pcVar23 = pcVar22, &local_3e8 != pcVar18)) {
        uVar6 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems;
        local_3e8.data._M_elems._8_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 2)
        ;
        local_3e8.data._M_elems._16_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 4)
        ;
        uVar6 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = pcVar18->exp;
        local_3e8.neg = pcVar18->neg;
        local_3e8.fpclass = pcVar18->fpclass;
        local_3e8.prec_elem = pcVar18->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      goto LAB_00243b96;
    case P_ON_LOWER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
      local_398->exp = pnVar5[lVar25].m_backend.exp;
      local_398->neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
      (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterLB->m_backend).prec_elem = iVar3;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) =
           *(undefined8 *)((local_398->data)._M_elems + 8);
      uVar6 = *(undefined8 *)(local_398->data)._M_elems;
      uVar9 = *(undefined8 *)((local_398->data)._M_elems + 2);
      uVar10 = *(undefined8 *)((local_398->data)._M_elems + 6);
      *(undefined8 *)((local_3a8->data)._M_elems + 4) =
           *(undefined8 *)((local_398->data)._M_elems + 4);
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
      local_3a8->exp = local_398->exp;
      local_3a8->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a8->fpclass = local_398->fpclass;
      local_3a8->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == local_398) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,&enterLB->m_backend);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != &enterLB->m_backend) {
          uVar6 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
          uVar6 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = (enterLB->m_backend).exp;
          local_3e8.neg = (enterLB->m_backend).neg;
          local_3e8.fpclass = (enterLB->m_backend).fpclass;
          local_3e8.prec_elem = (enterLB->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
      }
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar15 = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).exp = iVar15;
      bVar14 = pnVar5[lVar25].m_backend.neg;
      (enterRO->m_backend).neg = bVar14;
      fVar2 = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar15;
        local_3e8.neg = bVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
      local_2a8.m_backend.fpclass = (enterLB->m_backend).fpclass;
      if ((local_2a8.m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_3e8.fpclass != cpp_dec_float_NaN)) {
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterLB->m_backend,&local_3e8);
        if (iVar15 < 1) {
          pSVar19 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
          goto LAB_002445bb;
        }
        local_2a8.m_backend.fpclass = (enterLB->m_backend).fpclass;
      }
      local_2a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      pnVar26 = &local_2a8;
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      local_2a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      local_2a8.m_backend.exp = (enterLB->m_backend).exp;
      local_2a8.m_backend.neg = (enterLB->m_backend).neg;
      local_2a8.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
      local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
      local_2e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
      local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
      local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
      pnVar24 = &local_2e8;
      local_2e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
      local_2e8.m_backend.exp = local_398->exp;
      local_2e8.m_backend.neg = local_398->neg;
      local_2e8.m_backend.fpclass = local_398->fpclass;
      local_2e8.m_backend.prec_elem = local_398->prec_elem;
      RVar8 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pcVar21 = (cpp_dec_float<50u,int,void> *)&local_328;
      local_2f8 = 0xa00000000;
      local_328 = 0;
      uStack_320 = 0;
      local_318 = 0;
      uStack_310 = 0;
      uStack_30b = 0;
      uStack_308 = 0;
      uStack_303 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar21,RVar8);
      break;
    default:
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"XENTER03 This should never happen.","");
      *puVar20 = &PTR__SPxException_0069d438;
      puVar20[1] = puVar20 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar20 + 1),local_3e8.data._M_elems._0_8_,
                 local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
      *puVar20 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      pnVar5 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((local_398->data)._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_398->data)._M_elems = uVar6;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
      local_398->exp = pnVar5[lVar25].m_backend.exp;
      local_398->neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      pnVar5 = (this->theLRbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) = uVar6;
      uVar9 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar10 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = uVar11;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar12;
      *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar9;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar10;
      (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterLB->m_backend).prec_elem = iVar3;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 4) = uVar11;
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar12;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar9;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar10;
      local_3a8->exp = (enterLB->m_backend).exp;
      local_3a8->neg = (enterLB->m_backend).neg;
      iVar3 = (enterLB->m_backend).prec_elem;
      local_3a8->fpclass = (enterLB->m_backend).fpclass;
      local_3a8->prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      if (&local_3e8 == &enterLB->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,local_398);
        if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
          local_3e8.neg = (bool)(local_3e8.neg ^ 1);
        }
      }
      else {
        if (&local_3e8 != local_398) {
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 8);
          local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
          local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
          local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((local_398->data)._M_elems + 6);
          local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_3e8.exp = local_398->exp;
          local_3e8.neg = local_398->neg;
          local_3e8.fpclass = local_398->fpclass;
          local_3e8.prec_elem = local_398->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3e8,&enterLB->m_backend);
      }
      lVar13 = local_3b0;
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      pnVar5 = (this->theCoPvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
      uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
           *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
      (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
      (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
      uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
      (enterPric->m_backend).fpclass = (int)uVar6;
      (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      iVar15 = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).exp = iVar15;
      bVar14 = pnVar5[lVar25].m_backend.neg;
      (enterRO->m_backend).neg = bVar14;
      fVar2 = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).fpclass = fVar2;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).prec_elem = iVar3;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      pcVar23 = &enterRO->m_backend;
      if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.prec_elem = iVar3;
        local_3e8.fpclass = fVar2;
        local_3e8.exp = iVar15;
        local_3e8.neg = bVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,*(double *)(in_FS_OFFSET + -8));
      pcVar23 = local_398;
      local_228.m_backend.fpclass = local_398->fpclass;
      if ((local_228.m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_3e8.fpclass != cpp_dec_float_NaN)) {
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (local_398,&local_3e8);
        if (-1 < iVar15) {
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[lVar13] = D_ON_LOWER;
          return;
        }
        local_228.m_backend.fpclass = pcVar23->fpclass;
      }
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      pnVar26 = &local_1e8;
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      local_1e8.m_backend.exp = (enterLB->m_backend).exp;
      local_1e8.m_backend.neg = (enterLB->m_backend).neg;
      local_1e8.m_backend.fpclass = (enterLB->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
      local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
      local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
      local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
      local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
      pnVar24 = &local_228;
      local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
      local_228.m_backend.exp = pcVar23->exp;
      local_228.m_backend.neg = pcVar23->neg;
      local_228.m_backend.prec_elem = pcVar23->prec_elem;
      RVar8 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      pcVar21 = (cpp_dec_float<50u,int,void> *)&local_268;
      local_238 = 0xa00000000;
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      uStack_250 = 0;
      uStack_24b = 0;
      uStack_248 = 0;
      uStack_243 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar21,RVar8);
      break;
    case P_FREE:
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,"XENTER02 This should never happen.","");
      *puVar20 = &PTR__SPxException_0069d438;
      puVar20[1] = puVar20 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar20 + 1),local_3e8.data._M_elems._0_8_,
                 local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
      *puVar20 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    bVar14 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (pnVar26,pnVar24,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pcVar21);
    pSVar19 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data;
    goto LAB_00244594;
  }
  SPxColId::SPxColId((SPxColId *)&local_3e8,(SPxId *)&local_370);
  iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_3e8);
  lVar25 = (long)iVar15;
  *enterStat = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data[lVar25];
  if (this->theRep == COLUMN) {
    computePvec((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_3e8,this,iVar15);
    computeTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_3e8,this,iVar15);
    *(ulong *)((enterTest->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterTest->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(undefined8 *)(enterTest->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    (enterTest->m_backend).exp = local_3e8.exp;
    (enterTest->m_backend).neg = local_3e8.neg;
    (enterTest->m_backend).fpclass = local_3e8.fpclass;
    (enterTest->m_backend).prec_elem = local_3e8.prec_elem;
    pVVar17 = &this->theTest;
  }
  else {
    pVVar17 = &this->theCoTest;
    pnVar5 = (this->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterTest->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterTest->m_backend).data._M_elems + 2) = uVar9;
    (enterTest->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterTest->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterTest->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterTest->m_backend).prec_elem = iVar3;
  }
  local_3b0 = lVar25;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(pVVar17->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend,0);
  switch(*enterStat) {
  case D_FREE:
    ::soplex::infinity::__tls_init();
    local_388 = *(double *)(in_FS_OFFSET + -8);
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    uStack_380 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
    *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((local_398->data)._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((local_398->data)._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    local_398->exp = local_3e8.exp;
    local_398->neg = local_3e8.neg;
    local_398->fpclass = local_3e8.fpclass;
    local_398->prec_elem = local_3e8.prec_elem;
    ::soplex::infinity::__tls_init();
    uStack_38c = uStack_380._4_4_ ^ 0x80000000;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    local_398 = (cpp_dec_float<50U,_int,_void> *)-local_388;
    uStack_390 = (undefined4)uStack_380;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,-local_388);
    *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterLB->m_backend).exp = local_3e8.exp;
    (enterLB->m_backend).neg = local_3e8.neg;
    (enterLB->m_backend).fpclass = local_3e8.fpclass;
    (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a8,0);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(enterRO->m_backend).data._M_elems =
         *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    pnVar5 = (this->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    if ((((int)uVar6 == 2) || ((enterRO->m_backend).fpclass == cpp_dec_float_NaN)) ||
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterPric->m_backend,&enterRO->m_backend), iVar15 < 1)) {
      ::soplex::infinity::__tls_init();
      uVar27 = (undefined4)local_398;
      uVar28 = local_398._4_4_;
    }
    else {
      ::soplex::infinity::__tls_init();
      uVar27 = (undefined4)local_388;
      uVar28 = local_388._4_4_;
    }
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.neg = false;
    local_3e8.exp = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)CONCAT44(uVar28,uVar27));
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
    pSVar19 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_00243643:
    pSVar19[local_3b0] = P_FIXED;
    break;
  case D_ON_UPPER:
    pnVar5 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((local_398->data)._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_398->data)._M_elems = uVar6;
    *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
    local_398->exp = pnVar5[lVar25].m_backend.exp;
    local_398->neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
    local_398->prec_elem = iVar3;
    ::soplex::infinity::__tls_init();
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    local_388 = -*(double *)(in_FS_OFFSET + -8);
    uStack_380 = 0x8000000000000000;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterLB->m_backend).exp = local_3e8.exp;
    (enterLB->m_backend).neg = local_3e8.neg;
    (enterLB->m_backend).fpclass = local_3e8.fpclass;
    (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
    *(undefined8 *)((local_3a8->data)._M_elems + 8) =
         *(undefined8 *)((local_398->data)._M_elems + 8);
    uVar6 = *(undefined8 *)(local_398->data)._M_elems;
    uVar9 = *(undefined8 *)((local_398->data)._M_elems + 2);
    uVar10 = *(undefined8 *)((local_398->data)._M_elems + 6);
    *(undefined8 *)((local_3a8->data)._M_elems + 4) =
         *(undefined8 *)((local_398->data)._M_elems + 4);
    *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
    *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
    local_3a8->exp = local_398->exp;
    local_3a8->neg = local_398->neg;
    iVar3 = local_398->prec_elem;
    local_3a8->fpclass = local_398->fpclass;
    local_3a8->prec_elem = iVar3;
    pnVar5 = (this->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    iVar15 = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).exp = iVar15;
    bVar14 = pnVar5[lVar25].m_backend.neg;
    (enterRO->m_backend).neg = bVar14;
    fVar2 = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = &enterRO->m_backend;
    if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.prec_elem = iVar3;
      local_3e8.fpclass = fVar2;
      local_3e8.exp = iVar15;
      local_3e8.neg = bVar14;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = P_ON_LOWER;
    break;
  case D_ON_LOWER:
    pnVar5 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
    (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterLB->m_backend).prec_elem = iVar3;
    ::soplex::infinity::__tls_init();
    local_388 = *(double *)(in_FS_OFFSET + -8);
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
    *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((local_398->data)._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((local_398->data)._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    local_398->exp = local_3e8.exp;
    local_398->neg = local_3e8.neg;
    local_398->fpclass = local_3e8.fpclass;
    local_398->prec_elem = local_3e8.prec_elem;
    ::soplex::infinity::__tls_init();
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
    *(undefined8 *)((local_3a8->data)._M_elems + 8) =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
    uVar6 = *(undefined8 *)(enterLB->m_backend).data._M_elems;
    uVar9 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
    uVar10 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
    *(undefined8 *)((local_3a8->data)._M_elems + 4) =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
    *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
    *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
    local_3a8->exp = (enterLB->m_backend).exp;
    local_3a8->neg = (enterLB->m_backend).neg;
    iVar3 = (enterLB->m_backend).prec_elem;
    local_3a8->fpclass = (enterLB->m_backend).fpclass;
    local_3a8->prec_elem = iVar3;
    pnVar5 = (this->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    iVar15 = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).exp = iVar15;
    bVar14 = pnVar5[lVar25].m_backend.neg;
    (enterRO->m_backend).neg = bVar14;
    fVar2 = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = &enterRO->m_backend;
    if ((&local_3e8 != local_3a8) && (pcVar23 = local_3a8, &local_3e8 != &enterRO->m_backend)) {
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.prec_elem = iVar3;
      local_3e8.fpclass = fVar2;
      local_3e8.exp = iVar15;
      local_3e8.neg = bVar14;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = P_ON_UPPER;
    break;
  case D_ON_BOTH:
    pnVar5 = (this->theCoPvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    if ((((int)uVar6 == 2) ||
        (pnVar5 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pnVar5[lVar25].m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&enterPric->m_backend,&pnVar5[lVar25].m_backend), iVar15 < 1)) {
      pnVar5 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      *(undefined8 *)((local_398->data)._M_elems + 8) = uVar6;
      uVar9 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar10 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((local_398->data)._M_elems + 4) = uVar11;
      *(undefined8 *)((local_398->data)._M_elems + 6) = uVar12;
      *(undefined8 *)(local_398->data)._M_elems = uVar9;
      *(undefined8 *)((local_398->data)._M_elems + 2) = uVar10;
      local_398->exp = pnVar5[lVar25].m_backend.exp;
      local_398->neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
      local_398->prec_elem = iVar3;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 4) = uVar11;
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar12;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar9;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar10;
      local_3a8->exp = local_398->exp;
      local_3a8->neg = local_398->neg;
      iVar3 = local_398->prec_elem;
      local_3a8->fpclass = local_398->fpclass;
      local_3a8->prec_elem = iVar3;
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      local_3a8 = (cpp_dec_float<50U,_int,_void> *)
                  ((ulong)*(double *)(in_FS_OFFSET + -8) ^ 0x8000000000000000);
      uStack_3a0 = 0;
      uStack_39c = 0x80000000;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(enterLB->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterLB->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterLB->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterLB->m_backend).exp = local_3e8.exp;
      (enterLB->m_backend).neg = local_3e8.neg;
      (enterLB->m_backend).fpclass = local_3e8.fpclass;
      (enterLB->m_backend).prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)local_3a8);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      SVar16 = P_ON_LOWER;
    }
    else {
      pnVar5 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
      (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterLB->m_backend).prec_elem = iVar3;
      ::soplex::infinity::__tls_init();
      local_388 = *(double *)(in_FS_OFFSET + -8);
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(local_398->data)._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((local_398->data)._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((local_398->data)._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((local_398->data)._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((local_398->data)._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      local_398->exp = local_3e8.exp;
      local_398->neg = local_3e8.neg;
      local_398->fpclass = local_3e8.fpclass;
      local_398->prec_elem = local_3e8.prec_elem;
      ::soplex::infinity::__tls_init();
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 10;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems._24_5_ = 0;
      local_3e8.data._M_elems[7]._1_3_ = 0;
      local_3e8.data._M_elems._32_5_ = 0;
      local_3e8.data._M_elems[9]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_3e8,local_388);
      *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
      *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
      *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
           CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
      *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
           CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
      (enterMax->m_backend).exp = local_3e8.exp;
      (enterMax->m_backend).neg = local_3e8.neg;
      (enterMax->m_backend).fpclass = local_3e8.fpclass;
      (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
      *(undefined8 *)((local_3a8->data)._M_elems + 8) =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
      uVar6 = *(undefined8 *)(enterLB->m_backend).data._M_elems;
      uVar9 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
      uVar10 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
      *(undefined8 *)((local_3a8->data)._M_elems + 4) =
           *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
      *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
      *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
      *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
      local_3a8->exp = (enterLB->m_backend).exp;
      local_3a8->neg = (enterLB->m_backend).neg;
      iVar3 = (enterLB->m_backend).prec_elem;
      local_3a8->fpclass = (enterLB->m_backend).fpclass;
      local_3a8->prec_elem = iVar3;
      pnVar5 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
      uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
      uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
      uVar10 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
      *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
      (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
      (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
      iVar3 = pnVar5[lVar25].m_backend.prec_elem;
      (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
      (enterRO->m_backend).prec_elem = iVar3;
      SVar16 = P_ON_UPPER;
    }
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = SVar16;
    pcVar18 = &(this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    pcVar22 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = pcVar18;
    if ((&local_3e8 != pcVar22) && (pcVar23 = pcVar22, &local_3e8 != pcVar18)) {
      uVar6 = *(undefined8 *)((pcVar18->data)._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
      uVar6 = *(undefined8 *)((pcVar18->data)._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.exp = pcVar18->exp;
      local_3e8.neg = pcVar18->neg;
      local_3e8.fpclass = pcVar18->fpclass;
      local_3e8.prec_elem = pcVar18->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    pcVar18 = &(this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    pcVar22 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25].m_backend;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = pcVar18;
    if ((&local_3e8 != pcVar22) && (pcVar23 = pcVar22, &local_3e8 != pcVar18)) {
      uVar6 = *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems;
      local_3e8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 2);
      local_3e8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 4);
      uVar6 = *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.exp = pcVar18->exp;
      local_3e8.neg = pcVar18->neg;
      local_3e8.fpclass = pcVar18->fpclass;
      local_3e8.prec_elem = pcVar18->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
LAB_00243b96:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    break;
  case P_ON_LOWER:
    pnVar5 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((local_398->data)._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_398->data)._M_elems = uVar6;
    *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
    local_398->exp = pnVar5[lVar25].m_backend.exp;
    local_398->neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
    local_398->prec_elem = iVar3;
    pnVar5 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) = uVar6;
    uVar9 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar10 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar11 = *(undefined8 *)puVar1;
    uVar12 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = uVar11;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar12;
    *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar9;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar10;
    (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterLB->m_backend).prec_elem = iVar3;
    *(undefined8 *)((local_3a8->data)._M_elems + 8) = uVar6;
    *(undefined8 *)((local_3a8->data)._M_elems + 4) = uVar11;
    *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar12;
    *(undefined8 *)(local_3a8->data)._M_elems = uVar9;
    *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar10;
    local_3a8->exp = (enterLB->m_backend).exp;
    local_3a8->neg = (enterLB->m_backend).neg;
    iVar3 = (enterLB->m_backend).prec_elem;
    local_3a8->fpclass = (enterLB->m_backend).fpclass;
    local_3a8->prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    if (&local_3e8 == &enterLB->m_backend) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3e8,local_398);
      if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
        local_3e8.neg = (bool)(local_3e8.neg ^ 1);
      }
    }
    else {
      if (&local_3e8 != local_398) {
        uVar6 = *(undefined8 *)((local_398->data)._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((local_398->data)._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = local_398->exp;
        local_3e8.neg = local_398->neg;
        local_3e8.fpclass = local_398->fpclass;
        local_3e8.prec_elem = local_398->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3e8,&enterLB->m_backend);
    }
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
    pnVar5 = (this->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = local_3a8;
    if ((&local_3e8 != &enterRO->m_backend) &&
       (pcVar23 = &enterRO->m_backend, &local_3e8 != local_3a8)) {
      uVar6 = *(undefined8 *)((local_3a8->data)._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3a8->data)._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3a8->data)._M_elems + 2);
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3a8->data)._M_elems + 4);
      uVar6 = *(undefined8 *)((local_3a8->data)._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.exp = local_3a8->exp;
      local_3e8.neg = local_3a8->neg;
      local_3e8.fpclass = local_3a8->fpclass;
      local_3e8.prec_elem = local_3a8->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    ::soplex::infinity::__tls_init();
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,*(double *)(in_FS_OFFSET + -8));
    pcVar23 = local_398;
    local_168.m_backend.fpclass = local_398->fpclass;
    if ((local_168.m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_3e8.fpclass != cpp_dec_float_NaN)) {
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (local_398,&local_3e8);
      if (-1 < iVar15) {
        pSVar19 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data;
LAB_002445bb:
        pSVar19[local_3b0] = D_ON_UPPER;
        return;
      }
      local_168.m_backend.fpclass = pcVar23->fpclass;
    }
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
    pnVar26 = &local_128;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
    local_128.m_backend.exp = (enterLB->m_backend).exp;
    local_128.m_backend.neg = (enterLB->m_backend).neg;
    local_128.m_backend.fpclass = (enterLB->m_backend).fpclass;
    local_128.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
    pnVar24 = &local_168;
    local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
    local_168.m_backend.exp = pcVar23->exp;
    local_168.m_backend.neg = pcVar23->neg;
    local_168.m_backend.prec_elem = pcVar23->prec_elem;
    RVar8 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pcVar21 = (cpp_dec_float<50u,int,void> *)&local_1a8;
    local_178 = 0xa00000000;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_18b = 0;
    uStack_188 = 0;
    uStack_183 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar21,RVar8);
    goto LAB_00244099;
  default:
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_3e8.data._M_elems._0_8_ = local_3e8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e8,"XENTER01 This should never happen.","");
    *puVar20 = &PTR__SPxException_0069d438;
    puVar20[1] = puVar20 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar20 + 1),local_3e8.data._M_elems._0_8_,
               local_3e8.data._M_elems._0_8_ + local_3e8.data._M_elems._8_8_);
    *puVar20 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    pnVar5 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((local_398->data)._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_398->data)._M_elems = uVar6;
    *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
    local_398->exp = pnVar5[lVar25].m_backend.exp;
    local_398->neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
    local_398->prec_elem = iVar3;
    pnVar5 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
    (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterLB->m_backend).prec_elem = iVar3;
    *(undefined8 *)((local_3a8->data)._M_elems + 8) =
         *(undefined8 *)((local_398->data)._M_elems + 8);
    uVar6 = *(undefined8 *)(local_398->data)._M_elems;
    uVar9 = *(undefined8 *)((local_398->data)._M_elems + 2);
    uVar10 = *(undefined8 *)((local_398->data)._M_elems + 6);
    *(undefined8 *)((local_3a8->data)._M_elems + 4) =
         *(undefined8 *)((local_398->data)._M_elems + 4);
    *(undefined8 *)((local_3a8->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_3a8->data)._M_elems = uVar6;
    *(undefined8 *)((local_3a8->data)._M_elems + 2) = uVar9;
    local_3a8->exp = local_398->exp;
    local_3a8->neg = local_398->neg;
    iVar3 = local_398->prec_elem;
    local_3a8->fpclass = local_398->fpclass;
    local_3a8->prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    if (&local_3e8 == local_398) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3e8,&enterLB->m_backend);
      if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
        local_3e8.neg = (bool)(local_3e8.neg ^ 1);
      }
    }
    else {
      if (&local_3e8 != &enterLB->m_backend) {
        uVar6 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
        local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
        local_3e8.data._M_elems._8_8_ = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2);
        local_3e8.data._M_elems._16_8_ = *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
        local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_3e8.exp = (enterLB->m_backend).exp;
        local_3e8.neg = (enterLB->m_backend).neg;
        local_3e8.fpclass = (enterLB->m_backend).fpclass;
        local_3e8.prec_elem = (enterLB->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3e8,local_398);
    }
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
    pnVar5 = (this->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterRO->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar9;
    (enterRO->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).prec_elem = iVar3;
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    pcVar23 = local_3a8;
    if ((&local_3e8 != &enterRO->m_backend) &&
       (pcVar23 = &enterRO->m_backend, &local_3e8 != local_3a8)) {
      uVar6 = *(undefined8 *)((local_3a8->data)._M_elems + 8);
      local_3e8.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)(local_3a8->data)._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)((local_3a8->data)._M_elems + 2);
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)((local_3a8->data)._M_elems + 4);
      uVar6 = *(undefined8 *)((local_3a8->data)._M_elems + 6);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_3e8.exp = local_3a8->exp;
      local_3e8.neg = local_3a8->neg;
      local_3e8.fpclass = local_3a8->fpclass;
      local_3e8.prec_elem = local_3a8->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_3e8,pcVar23);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_3e8);
    ::soplex::infinity::__tls_init();
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,-*(double *)(in_FS_OFFSET + -8));
    local_68.m_backend.fpclass = (enterLB->m_backend).fpclass;
    if ((local_68.m_backend.fpclass != cpp_dec_float_NaN) &&
       (local_3e8.fpclass != cpp_dec_float_NaN)) {
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&enterLB->m_backend,&local_3e8);
      if (iVar15 < 1) {
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.colstat.data[local_3b0] = D_ON_LOWER;
        return;
      }
      local_68.m_backend.fpclass = (enterLB->m_backend).fpclass;
    }
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 8);
    pnVar26 = &local_68;
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterLB->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((enterLB->m_backend).data._M_elems + 2)
    ;
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterLB->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (enterLB->m_backend).exp;
    local_68.m_backend.neg = (enterLB->m_backend).neg;
    local_68.m_backend.prec_elem = (enterLB->m_backend).prec_elem;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_398->data)._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_398->data)._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_398->data)._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_398->data)._M_elems + 6);
    pnVar24 = &local_a8;
    local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_398->data)._M_elems + 8);
    local_a8.m_backend.exp = local_398->exp;
    local_a8.m_backend.neg = local_398->neg;
    local_a8.m_backend.fpclass = local_398->fpclass;
    local_a8.m_backend.prec_elem = local_398->prec_elem;
    RVar8 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pcVar21 = (cpp_dec_float<50u,int,void> *)&local_e8;
    local_b8 = 0xa00000000;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    uStack_cb = 0;
    uStack_c8 = 0;
    uStack_c3 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar21,RVar8);
LAB_00244099:
    bVar14 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (pnVar26,pnVar24,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)pcVar21);
    pSVar19 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_00244594:
    if (bVar14 == false) {
      pSVar19[local_3b0] = D_ON_BOTH;
    }
    else {
      pSVar19[local_3b0] = D_FREE;
    }
    break;
  case P_FREE:
    pnVar5 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((local_398->data)._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((local_398->data)._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((local_398->data)._M_elems + 6) = uVar10;
    *(undefined8 *)(local_398->data)._M_elems = uVar6;
    *(undefined8 *)((local_398->data)._M_elems + 2) = uVar9;
    local_398->exp = pnVar5[lVar25].m_backend.exp;
    local_398->neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    local_398->fpclass = pnVar5[lVar25].m_backend.fpclass;
    local_398->prec_elem = iVar3;
    pnVar5 = (this->theLCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterLB->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterLB->m_backend).data._M_elems + 2) = uVar9;
    (enterLB->m_backend).exp = pnVar5[lVar25].m_backend.exp;
    (enterLB->m_backend).neg = pnVar5[lVar25].m_backend.neg;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterLB->m_backend).fpclass = pnVar5[lVar25].m_backend.fpclass;
    (enterLB->m_backend).prec_elem = iVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_3a8,0);
    pnVar5 = (this->thePvec->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[lVar25].m_backend;
    uVar9 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend + 8);
    uVar10 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x18);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 4) =
         *(undefined8 *)((long)(pnVar5 + lVar25) + 0x10);
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(enterPric->m_backend).data._M_elems = uVar6;
    *(undefined8 *)((enterPric->m_backend).data._M_elems + 2) = uVar9;
    (enterPric->m_backend).exp = *(int *)((long)(pnVar5 + lVar25) + 0x28);
    (enterPric->m_backend).neg = *(bool *)((long)(pnVar5 + lVar25) + 0x2c);
    uVar6 = *(undefined8 *)((long)(pnVar5 + lVar25) + 0x30);
    (enterPric->m_backend).fpclass = (int)uVar6;
    (enterPric->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
    pnVar5 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(enterRO->m_backend).data._M_elems =
         *(undefined8 *)&pnVar5[lVar25].m_backend.data;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 2) = uVar6;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)((enterRO->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
    iVar15 = pnVar5[lVar25].m_backend.exp;
    (enterRO->m_backend).exp = iVar15;
    bVar14 = pnVar5[lVar25].m_backend.neg;
    (enterRO->m_backend).neg = bVar14;
    fVar2 = pnVar5[lVar25].m_backend.fpclass;
    (enterRO->m_backend).fpclass = fVar2;
    iVar3 = pnVar5[lVar25].m_backend.prec_elem;
    (enterRO->m_backend).prec_elem = iVar3;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[local_3b0] = D_UNDEFINED;
    local_368.fpclass = cpp_dec_float_finite;
    local_368.prec_elem = 10;
    local_368.data._M_elems[0] = 0;
    local_368.data._M_elems[1] = 0;
    local_368.data._M_elems[2] = 0;
    local_368.data._M_elems[3] = 0;
    local_368.data._M_elems[4] = 0;
    local_368.data._M_elems[5] = 0;
    local_368.data._M_elems._24_5_ = 0;
    local_368.data._M_elems[7]._1_3_ = 0;
    local_368.data._M_elems._32_5_ = 0;
    local_368.data._M_elems[9]._1_3_ = 0;
    local_368.exp = 0;
    local_368.neg = false;
    if (&local_368 == &enterPric->m_backend) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_368,&enterRO->m_backend);
      if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
        local_368.neg = (bool)(local_368.neg ^ 1);
        goto LAB_0024391f;
      }
LAB_00243929:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_3e8,0,(type *)0x0);
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_368,&local_3e8);
      if (iVar15 < 1) goto LAB_00243969;
      ::soplex::infinity::__tls_init();
      uVar27 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uVar29 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    }
    else {
      if (&local_368 != &enterRO->m_backend) {
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 8);
        local_368.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_368.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_368.data._M_elems._0_8_ = *(undefined8 *)(enterRO->m_backend).data._M_elems;
        local_368.data._M_elems._8_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 2);
        local_368.data._M_elems._16_8_ = *(undefined8 *)((enterRO->m_backend).data._M_elems + 4);
        uVar6 = *(undefined8 *)((enterRO->m_backend).data._M_elems + 6);
        local_368.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_368.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_368.prec_elem = iVar3;
        local_368.fpclass = fVar2;
        local_368.exp = iVar15;
        local_368.neg = bVar14;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_368,&enterPric->m_backend);
LAB_0024391f:
      if (local_368.fpclass != cpp_dec_float_NaN) goto LAB_00243929;
LAB_00243969:
      ::soplex::infinity::__tls_init();
      uVar27 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uVar29 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20) ^ 0x80000000;
    }
    local_3e8.fpclass = cpp_dec_float_finite;
    local_3e8.prec_elem = 10;
    local_3e8.data._M_elems[0] = 0;
    local_3e8.data._M_elems[1] = 0;
    local_3e8.data._M_elems[2] = 0;
    local_3e8.data._M_elems[3] = 0;
    local_3e8.data._M_elems[4] = 0;
    local_3e8.data._M_elems[5] = 0;
    local_3e8.data._M_elems._24_5_ = 0;
    local_3e8.data._M_elems[7]._1_3_ = 0;
    local_3e8.data._M_elems._32_5_ = 0;
    local_3e8.data._M_elems[9]._1_3_ = 0;
    local_3e8.exp = 0;
    local_3e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_3e8,(double)CONCAT44(uVar29,uVar27));
    *(undefined8 *)(enterMax->m_backend).data._M_elems = local_3e8.data._M_elems._0_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 2) = local_3e8.data._M_elems._8_8_;
    *(undefined8 *)((enterMax->m_backend).data._M_elems + 4) = local_3e8.data._M_elems._16_8_;
    *(ulong *)((enterMax->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.data._M_elems[7]._1_3_,local_3e8.data._M_elems._24_5_);
    *(ulong *)((enterMax->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.data._M_elems[9]._1_3_,local_3e8.data._M_elems._32_5_);
    (enterMax->m_backend).exp = local_3e8.exp;
    (enterMax->m_backend).neg = local_3e8.neg;
    (enterMax->m_backend).fpclass = local_3e8.fpclass;
    (enterMax->m_backend).prec_elem = local_3e8.prec_elem;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}